

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTTGame.cpp
# Opt level: O2

void __thiscall TTTGame::TTTGame(TTTGame *this,string *name,Player *player1)

{
  Player::Player(&this->m_player1,player1);
  Player::Player(&this->m_player2,-1);
  std::__cxx11::string::string((string *)&this->m_name,(string *)name);
  return;
}

Assistant:

TTTGame::TTTGame(string name, Player player1)
    : m_player1(player1), m_player2(-1), m_name(name)
{ }